

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

Ptr __thiscall SimpleSyntaxAnalyzer::analyze(SimpleSyntaxAnalyzer *this,TokenReader *tokens)

{
  bool bVar1;
  byte bVar2;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ptr PVar4;
  shared_ptr<SimpleASTNode> local_e0;
  shared_ptr<SimpleASTNode> local_d0;
  shared_ptr<SimpleASTNode> local_c0;
  undefined1 local_b0 [8];
  Ptr child;
  shared_ptr<SimpleASTNode> local_98;
  Token local_88;
  undefined1 local_50 [8];
  Token token;
  TokenReader *tokens_local;
  SimpleSyntaxAnalyzer *this_local;
  Ptr *node;
  
  token._39_1_ = 0;
  std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)this,(nullptr_t)0x0);
  TokenReader::peek();
  bVar1 = Token::isEmpty((Token *)local_50);
  if (!bVar1) {
    if (local_50._0_4_ == KEY_TYPE) {
      TokenReader::read();
      Token::operator=((Token *)local_50,&local_88);
      Token::~Token(&local_88);
      child.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           0;
      SimpleASTNode::create
                ((ASTNodeType *)&local_98,
                 (string *)
                 ((long)&child.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4));
      std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)this,&local_98);
      std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_98);
      while (bVar2 = TokenReader::end(), ((bVar2 ^ 0xff) & 1) != 0) {
        std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)local_b0);
        express((TokenReader *)&local_c0);
        std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)local_b0,&local_c0);
        std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_c0);
        this_00 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        std::shared_ptr<SimpleASTNode>::shared_ptr(&local_d0,(shared_ptr<SimpleASTNode> *)local_b0);
        SimpleASTNode::addChild(this_00,&local_d0);
        std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_d0);
        std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_b0);
      }
    }
    else {
      express((TokenReader *)&local_e0);
      std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)this,&local_e0);
      std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_e0);
    }
  }
  token._39_1_ = 1;
  Token::~Token((Token *)local_50);
  _Var3._M_pi = extraout_RDX;
  if ((token._39_1_ & 1) == 0) {
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SimpleASTNode::Ptr SimpleSyntaxAnalyzer::analyze(TokenReader& tokens)
{
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    if (!token.isEmpty()) {
        if (token.type == TokenType::KEY_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create(ASTNodeType::DECLARATION, token.val);
            while (!tokens.end()) {
                SimpleASTNode::Ptr child;
                child = express(tokens);
                node->addChild(child);
            }
        } else {
            node = express(tokens);
        }
    }
    return node;
}